

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

int proxy_worker_init(proxy_worker *pw)

{
  int ret;
  proxy_worker *pw_local;
  
  pw_local._4_4_ = mutex_init(&pw->mutex);
  if (-1 < pw_local._4_4_) {
    (pw->worker).func_ctx = pw;
    (pw->worker).func_ptr = proxy_worker_func;
    (pw->worker).stack_size = 0x100000;
    pw_local._4_4_ = worker_init(&pw->worker);
    if (pw_local._4_4_ < 0) {
      mutex_free(&pw->mutex);
    }
    else {
      pw_local._4_4_ = 0;
    }
  }
  return pw_local._4_4_;
}

Assistant:

static int proxy_worker_init(struct proxy_worker *pw)
{
	int ret;

	ret = mutex_init(&pw->mutex);
	if (ret < 0)
		return ret;

	pw->worker.func_ctx = pw;
	pw->worker.func_ptr = proxy_worker_func;
	pw->worker.stack_size = 1024 * 1024;
	ret = worker_init(&pw->worker);
	if (ret < 0)
		goto proxy_worker_init_exit;

	return 0;

proxy_worker_init_exit:
	mutex_free(&pw->mutex);

	return ret;
}